

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O2

void __thiscall duckdb::MetadataManager::Flush(MetadataManager *this)

{
  _Prime_rehash_policy *this_00;
  BufferHandle *this_01;
  BlockManager *pBVar1;
  idx_t iVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  BlockHandle *pBVar5;
  FileBuffer *pFVar6;
  __node_base *p_Var7;
  BufferHandle handle;
  BufferHandle local_98;
  shared_ptr<duckdb::BlockHandle,_true> *local_80;
  BlockManager *local_78;
  BufferHandle local_70;
  undefined1 local_58 [40];
  
  iVar2 = GetMetadataBlockSize(this);
  p_Var7 = &(this->blocks)._M_h._M_before_begin;
  this_01 = (BufferHandle *)(local_58 + 0x10);
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    this_00 = (_Prime_rehash_policy *)(p_Var7 + 2);
    (*this->buffer_manager->_vptr_BufferManager[7])(this_01,this->buffer_manager,this_00);
    pdVar3 = BufferHandle::Ptr(this_01);
    iVar4 = BlockManager::GetBlockSize(this->block_manager);
    switchD_016d4fed::default(pdVar3 + iVar2 * 0x40,0,iVar4 + iVar2 * -0x40);
    pBVar5 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                       ((shared_ptr<duckdb::BlockHandle,_true> *)this_00);
    if (pBVar5->block_id < 0x4000000000000060) {
      pBVar1 = this->block_manager;
      pFVar6 = BufferHandle::GetFileBuffer(this_01);
      (*pBVar1->_vptr_BlockManager[0xe])(pBVar1,pFVar6,p_Var7[4]._M_nxt);
    }
    else {
      local_78 = this->block_manager;
      local_80 = *(shared_ptr<duckdb::BlockHandle,_true> **)(p_Var7 + 1);
      local_98.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = *(element_type **)&((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor;
      local_98.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var7 + 3);
      p_Var7[3] = (_Hash_node_base *)0x0;
      *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor =
           (_Hash_node_base *)0x0;
      BufferHandle::BufferHandle(&local_70,this_01);
      BlockManager::ConvertToPersistent
                ((BlockManager *)local_58,(block_id_t)local_78,local_80,&local_98);
      shared_ptr<duckdb::BlockHandle,_true>::operator=
                ((shared_ptr<duckdb::BlockHandle,_true> *)this_00,
                 (shared_ptr<duckdb::BlockHandle,_true> *)local_58);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
      BufferHandle::~BufferHandle(&local_70);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_98.handle.internal.
                  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    BufferHandle::~BufferHandle(this_01);
  }
  return;
}

Assistant:

void MetadataManager::Flush() {
	const idx_t total_metadata_size = GetMetadataBlockSize() * METADATA_BLOCK_COUNT;

	// write the blocks of the metadata manager to disk
	for (auto &kv : blocks) {
		auto &block = kv.second;
		auto handle = buffer_manager.Pin(block.block);
		// zero-initialize the few leftover bytes
		memset(handle.Ptr() + total_metadata_size, 0, block_manager.GetBlockSize() - total_metadata_size);
		D_ASSERT(kv.first == block.block_id);
		if (block.block->BlockId() >= MAXIMUM_BLOCK) {
			// temporary block - convert to persistent
			block.block = block_manager.ConvertToPersistent(kv.first, std::move(block.block), std::move(handle));
		} else {
			// already a persistent block - only need to write it
			D_ASSERT(block.block->BlockId() == block.block_id);
			block_manager.Write(handle.GetFileBuffer(), block.block_id);
		}
	}
}